

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void * tlb_vaddr_to_host_x86_64
                 (CPUArchState *env,abi_ptr addr,MMUAccessType access_type,int mmu_idx)

{
  uc_struct_conflict *uc_00;
  _Bool _Var1;
  uintptr_t index_00;
  CPUState *pCVar2;
  CPUClass *cc;
  CPUState *cs;
  uintptr_t index;
  size_t elt_ofs;
  target_ulong page;
  target_ulong tlb_addr;
  CPUTLBEntry *entry;
  uc_struct_conflict *uc;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  abi_ptr addr_local;
  CPUArchState *env_local;
  
  uc_00 = env->uc;
  tlb_addr = (target_ulong)tlb_entry(env,(long)mmu_idx,addr);
  if (access_type == MMU_DATA_LOAD) {
    index = 0;
  }
  else if (access_type == MMU_DATA_STORE) {
    index = 8;
  }
  else {
    if (access_type != MMU_INST_FETCH) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                 ,0x4f9,(char *)0x0);
    }
    index = 0x10;
  }
  page = tlb_read_ofs((CPUTLBEntry *)tlb_addr,index);
  _Var1 = tlb_hit_page(uc_00,page,addr & 0xfffffffffffff000);
  if (!_Var1) {
    index_00 = tlb_index(env,(long)mmu_idx,addr);
    _Var1 = victim_tlb_hit(env,(long)mmu_idx,index_00,index,addr & 0xfffffffffffff000);
    if (!_Var1) {
      pCVar2 = env_cpu(env);
      _Var1 = (*pCVar2->cc->tlb_fill)((CPUState_conflict *)pCVar2,addr,0,access_type,mmu_idx,true,0)
      ;
      if (!_Var1) {
        return (void *)0x0;
      }
      tlb_addr = (target_ulong)tlb_entry(env,(long)mmu_idx,addr);
    }
    page = tlb_read_ofs((CPUTLBEntry *)tlb_addr,index);
  }
  if ((page & 0xfff) == 0) {
    env_local = (CPUArchState *)(addr + *(long *)(tlb_addr + 0x20));
  }
  else {
    env_local = (CPUArchState *)0x0;
  }
  return env_local;
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}